

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  undefined8 *puVar2;
  int *piVar3;
  uint *puVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar17;
  __m128i *b_00;
  __m128i *palVar18;
  __m128i *ptr;
  __m128i *ptr_00;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  undefined8 uVar24;
  long lVar25;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  long lVar26;
  __m128i *palVar27;
  __m128i *ptr_01;
  uint uVar28;
  int a;
  long lVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ulong size;
  __m128i *ptr_02;
  int iVar40;
  int iVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  uint uVar44;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 auVar45 [16];
  uint uVar50;
  undefined1 auVar46 [16];
  int iVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar60;
  uint uVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar69;
  int iVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  uint local_10c;
  int local_104;
  __m128i *local_f8;
  ulong local_d8;
  long local_b8;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_trace_striped_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_trace_striped_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_trace_striped_profile_sse2_128_32_cold_6();
      }
      else {
        uVar28 = profile->s1Len;
        if ((int)uVar28 < 1) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_4();
        }
        else {
          local_d8 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_trace_striped_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_trace_striped_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_trace_striped_profile_sse2_128_32_cold_1();
          }
          else {
            uVar20 = (ulong)uVar28 + 3;
            size = uVar20 >> 2;
            iVar16 = ppVar6->max;
            uVar24 = 0x10;
            a = (int)size;
            result = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (result != (parasail_result_t *)0x0) {
              result->flag = result->flag | 0x4480804;
              b = parasail_memalign___m128i(0x10,size);
              palVar17 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              palVar18 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              local_f8 = parasail_memalign___m128i(0x10,size);
              auVar59._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
              auVar59._4_4_ = -(uint)((int)palVar17 == 0 && (int)((ulong)palVar17 >> 0x20) == 0);
              auVar59._8_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
              auVar59._12_4_ = -(uint)((int)palVar18 == 0 && (int)((ulong)palVar18 >> 0x20) == 0);
              iVar21 = movmskps((int)uVar24,auVar59);
              len = CONCAT44((int)((ulong)uVar24 >> 0x20),iVar21);
              if (iVar21 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_00 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_f8 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              c[1] = (longlong)local_f8;
              c[0] = size;
              parasail_memset___m128i(b,c,len);
              iVar21 = -open;
              c_00[1] = extraout_RDX;
              c_00[0] = size;
              parasail_memset___m128i(b_00,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = size;
              parasail_memset___m128i(palVar18,c_01,len);
              lVar25 = 0;
              do {
                puVar2 = (undefined8 *)((long)((result->field_4).rowcols)->score_row + lVar25);
                *puVar2 = 0x800000008;
                puVar2[1] = 0x800000008;
                auVar13 = _DAT_00906b10;
                auVar12 = _DAT_00906760;
                auVar11 = _DAT_00906750;
                auVar63 = _DAT_00906740;
                auVar42 = _DAT_00906730;
                auVar59 = _DAT_00906720;
                lVar25 = lVar25 + 0x10;
              } while (size << 4 != lVar25);
              lVar25 = size * 0x10;
              local_10c = 0xc0000000;
              lVar29 = 0;
              local_104 = 0;
              auVar64 = (undefined1  [16])0x0;
              uVar15 = 0;
              uVar22 = 0;
              uVar23 = 0;
              uVar44 = 0;
              uVar30 = 0;
              local_b8 = lVar25;
              do {
                ptr_02 = b;
                ptr_01 = ptr;
                ptr = palVar18;
                palVar18 = ptr_02 + (a - 1U);
                lVar26 = size * (long)ppVar6->mapper[(byte)s2[uVar30]];
                b = palVar17;
                if (local_104 == (int)uVar30 + -2) {
                  b = local_f8;
                  local_f8 = palVar17;
                }
                palVar17 = ptr_02 + (a - 1U);
                iVar31 = (int)(*palVar17)[0];
                iVar40 = *(int *)((long)*palVar17 + 4);
                iVar41 = (int)(*palVar17)[1];
                iVar14 = 0;
                uVar1 = uVar30 + 1;
                uVar19 = 1;
                lVar33 = 0;
                auVar67._4_4_ = -open;
                auVar67._0_4_ = -open;
                auVar67._8_4_ = -open;
                auVar67._12_4_ = -open;
                do {
                  piVar3 = (int *)((long)pvVar5 + lVar33 + lVar26 * 0x10);
                  auVar75._0_4_ = iVar14 + *piVar3;
                  auVar75._4_4_ = iVar31 + piVar3[1];
                  auVar75._8_4_ = iVar40 + piVar3[2];
                  auVar75._12_4_ = iVar41 + piVar3[3];
                  auVar35 = *(undefined1 (*) [16])((long)*b_00 + lVar33);
                  auVar45._0_4_ = -(uint)(0 < auVar75._0_4_);
                  auVar45._4_4_ = -(uint)(0 < auVar75._4_4_);
                  auVar45._8_4_ = -(uint)(0 < auVar75._8_4_);
                  auVar45._12_4_ = -(uint)(0 < auVar75._12_4_);
                  auVar45 = auVar45 & auVar75;
                  auVar72._0_4_ = -(uint)(auVar35._0_4_ < auVar45._0_4_);
                  auVar72._4_4_ = -(uint)(auVar35._4_4_ < auVar45._4_4_);
                  auVar72._8_4_ = -(uint)(auVar35._8_4_ < auVar45._8_4_);
                  auVar72._12_4_ = -(uint)(auVar35._12_4_ < auVar45._12_4_);
                  auVar72 = ~auVar72 & auVar35 | auVar45 & auVar72;
                  auVar76._0_4_ = -(uint)(auVar67._0_4_ < auVar72._0_4_);
                  auVar76._4_4_ = -(uint)(auVar67._4_4_ < auVar72._4_4_);
                  auVar76._8_4_ = -(uint)(auVar67._8_4_ < auVar72._8_4_);
                  auVar76._12_4_ = -(uint)(auVar67._12_4_ < auVar72._12_4_);
                  auVar72 = ~auVar76 & auVar67 | auVar72 & auVar76;
                  *(undefined1 (*) [16])((long)*b + lVar33) = auVar72;
                  iVar14 = auVar72._0_4_;
                  uVar43 = -(uint)(auVar45._0_4_ == iVar14);
                  iVar31 = auVar72._4_4_;
                  uVar47 = -(uint)(auVar45._4_4_ == iVar31);
                  iVar40 = auVar72._8_4_;
                  uVar48 = -(uint)(auVar45._8_4_ == iVar40);
                  iVar41 = auVar72._12_4_;
                  uVar50 = -(uint)(auVar45._12_4_ == iVar41);
                  uVar49 = ~uVar43 & auVar76._0_4_ + auVar12._0_4_ |
                           ~-(uint)(iVar14 == 0) & uVar43 & 4;
                  uVar52 = ~uVar47 & auVar76._4_4_ + auVar12._4_4_ |
                           ~-(uint)(iVar31 == 0) & uVar47 & 4;
                  uVar53 = ~uVar48 & auVar76._8_4_ + auVar12._8_4_ |
                           ~-(uint)(iVar40 == 0) & uVar48 & 4;
                  uVar54 = ~uVar50 & auVar76._12_4_ + auVar12._12_4_ |
                           ~-(uint)(iVar41 == 0) & uVar50 & 4;
                  puVar4 = (uint *)((long)((result->field_4).rowcols)->score_row + lVar33 + lVar29);
                  uVar43 = *puVar4;
                  uVar47 = puVar4[1];
                  uVar48 = puVar4[2];
                  uVar50 = puVar4[3];
                  puVar4 = (uint *)((long)*ptr_00 + lVar33);
                  *puVar4 = uVar49;
                  puVar4[1] = uVar52;
                  puVar4[2] = uVar53;
                  puVar4[3] = uVar54;
                  puVar4 = (uint *)((long)((result->field_4).rowcols)->score_row + lVar33 + lVar29);
                  *puVar4 = uVar43 | uVar49;
                  puVar4[1] = uVar47 | uVar52;
                  puVar4[2] = uVar48 | uVar53;
                  puVar4[3] = uVar50 | uVar54;
                  auVar56._0_4_ = iVar14 - open;
                  auVar56._4_4_ = iVar31 - open;
                  auVar56._8_4_ = iVar40 - open;
                  auVar56._12_4_ = iVar41 - open;
                  auVar81._0_4_ = auVar35._0_4_ - gap;
                  auVar81._4_4_ = auVar35._4_4_ - gap;
                  auVar81._8_4_ = auVar35._8_4_ - gap;
                  auVar81._12_4_ = auVar35._12_4_ - gap;
                  auVar35._0_4_ = -(uint)(auVar81._0_4_ < auVar56._0_4_);
                  auVar35._4_4_ = -(uint)(auVar81._4_4_ < auVar56._4_4_);
                  auVar35._8_4_ = -(uint)(auVar81._8_4_ < auVar56._8_4_);
                  auVar35._12_4_ = -(uint)(auVar81._12_4_ < auVar56._12_4_);
                  *(undefined1 (*) [16])((long)*b_00 + lVar33) =
                       ~auVar35 & auVar81 | auVar56 & auVar35;
                  piVar3 = (int *)((long)*ptr + lVar33);
                  auVar77._0_4_ = *piVar3 - gap;
                  auVar77._4_4_ = piVar3[1] - gap;
                  auVar77._8_4_ = piVar3[2] - gap;
                  auVar77._12_4_ = piVar3[3] - gap;
                  auVar73._0_4_ = -(uint)(auVar77._0_4_ < auVar56._0_4_);
                  auVar73._4_4_ = -(uint)(auVar77._4_4_ < auVar56._4_4_);
                  auVar73._8_4_ = -(uint)(auVar77._8_4_ < auVar56._8_4_);
                  auVar73._12_4_ = -(uint)(auVar77._12_4_ < auVar56._12_4_);
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar33) =
                       ~auVar73 & auVar77 | auVar56 & auVar73;
                  if (uVar1 < local_d8) {
                    *(undefined1 (*) [16])
                     ((long)((result->field_4).rowcols)->score_row + lVar33 + local_b8) =
                         auVar73 & auVar59 ^ auVar42;
                  }
                  auVar83._0_4_ = auVar67._0_4_ - gap;
                  auVar83._4_4_ = auVar67._4_4_ - gap;
                  auVar83._8_4_ = auVar67._8_4_ - gap;
                  auVar83._12_4_ = auVar67._12_4_ - gap;
                  auVar66._0_4_ = -(uint)(auVar83._0_4_ < auVar56._0_4_);
                  auVar66._4_4_ = -(uint)(auVar83._4_4_ < auVar56._4_4_);
                  auVar66._8_4_ = -(uint)(auVar83._8_4_ < auVar56._8_4_);
                  auVar66._12_4_ = -(uint)(auVar83._12_4_ < auVar56._12_4_);
                  if (uVar19 < size) {
                    piVar3 = ((result->field_4).rowcols)->score_row;
                    *(undefined1 (*) [16])((long)piVar3 + lVar33 + 0x10 + lVar29) =
                         auVar66 & auVar63 ^ auVar11 |
                         *(undefined1 (*) [16])((long)piVar3 + lVar33 + 0x10 + lVar29);
                  }
                  auVar46._0_4_ = -(uint)(auVar64._0_4_ < iVar14);
                  auVar46._4_4_ = -(uint)(auVar64._4_4_ < iVar31);
                  auVar46._8_4_ = -(uint)(auVar64._8_4_ < iVar40);
                  auVar46._12_4_ = -(uint)(auVar64._12_4_ < iVar41);
                  auVar64 = ~auVar46 & auVar64 | auVar72 & auVar46;
                  auVar67 = ~auVar66 & auVar83 | auVar56 & auVar66;
                  piVar3 = (int *)((long)*ptr_02 + lVar33);
                  iVar14 = *piVar3;
                  iVar31 = piVar3[1];
                  iVar40 = piVar3[2];
                  iVar41 = piVar3[3];
                  lVar33 = lVar33 + 0x10;
                  uVar19 = uVar19 + 1;
                } while (lVar25 != lVar33);
                iVar14 = 0;
                auVar80 = auVar67;
                do {
                  auVar7._4_8_ = auVar80._8_8_;
                  auVar7._0_4_ = auVar80._0_4_;
                  auVar78._0_8_ = auVar7._0_8_ << 0x20;
                  auVar78._8_4_ = auVar80._4_4_;
                  auVar78._12_4_ = auVar80._8_4_;
                  auVar80._4_12_ = auVar78._4_12_;
                  auVar80._0_4_ = iVar21;
                  auVar8._4_8_ = auVar83._8_8_;
                  auVar8._0_4_ = auVar83._0_4_;
                  auVar82._0_8_ = auVar8._0_8_ << 0x20;
                  auVar82._8_4_ = auVar83._4_4_;
                  auVar82._12_4_ = auVar83._8_4_;
                  auVar83._4_12_ = auVar82._4_12_;
                  auVar83._0_4_ = 0xc0000000;
                  auVar9._4_8_ = auVar67._8_8_;
                  auVar9._0_4_ = auVar67._0_4_;
                  auVar68._0_8_ = auVar9._0_8_ << 0x20;
                  auVar68._8_4_ = auVar67._4_4_;
                  auVar68._12_4_ = auVar67._8_4_;
                  auVar67._4_12_ = auVar68._4_12_;
                  auVar67._0_4_ = iVar21;
                  auVar10._4_8_ = auVar56._8_8_;
                  auVar10._0_4_ = auVar56._0_4_;
                  auVar55._0_8_ = auVar10._0_8_ << 0x20;
                  auVar55._8_4_ = auVar56._4_4_;
                  auVar55._12_4_ = auVar56._8_4_;
                  auVar56._4_12_ = auVar55._4_12_;
                  auVar56._0_4_ = iVar21;
                  iVar40 = (int)(*palVar18)[0];
                  iVar41 = *(int *)((long)*palVar18 + 4);
                  iVar51 = (int)(*palVar18)[1];
                  iVar31 = 0;
                  lVar33 = 0;
                  do {
                    auVar57._0_4_ = -(uint)(auVar83._0_4_ < auVar56._0_4_);
                    auVar57._4_4_ = -(uint)(auVar83._4_4_ < auVar56._4_4_);
                    auVar57._8_4_ = -(uint)(auVar83._8_4_ < auVar56._8_4_);
                    auVar57._12_4_ = -(uint)(auVar83._12_4_ < auVar56._12_4_);
                    auVar35 = *(undefined1 (*) [16])((long)*b + lVar33);
                    auVar74._0_4_ = -(uint)(auVar67._0_4_ < auVar35._0_4_);
                    iVar69 = auVar67._4_4_;
                    auVar74._4_4_ = -(uint)(iVar69 < auVar35._4_4_);
                    iVar70 = auVar67._8_4_;
                    auVar74._8_4_ = -(uint)(iVar70 < auVar35._8_4_);
                    iVar71 = auVar67._12_4_;
                    auVar74._12_4_ = -(uint)(iVar71 < auVar35._12_4_);
                    auVar45 = ~auVar74 & auVar67 | auVar35 & auVar74;
                    *(undefined1 (*) [16])((long)*b + lVar33) = auVar45;
                    piVar3 = (int *)((long)pvVar5 + lVar33 + lVar26 * 0x10);
                    uVar43 = auVar45._0_4_;
                    auVar34._0_4_ =
                         -(uint)((-(uint)(0 < iVar31 + *piVar3) & iVar31 + *piVar3) == uVar43);
                    uVar47 = auVar45._4_4_;
                    auVar34._4_4_ =
                         -(uint)((-(uint)(0 < iVar40 + piVar3[1]) & iVar40 + piVar3[1]) == uVar47);
                    uVar48 = auVar45._8_4_;
                    auVar34._8_4_ =
                         -(uint)((-(uint)(0 < iVar41 + piVar3[2]) & iVar41 + piVar3[2]) == uVar48);
                    uVar50 = auVar45._12_4_;
                    auVar34._12_4_ =
                         -(uint)((-(uint)(0 < iVar51 + piVar3[3]) & iVar51 + piVar3[3]) == uVar50);
                    auVar72 = *(undefined1 (*) [16])
                               ((long)((result->field_4).rowcols)->score_row + lVar33 + lVar29) &
                              _DAT_00906b00;
                    auVar35 = ~(auVar34 | auVar74) & auVar12 |
                              *(undefined1 (*) [16])((long)*ptr_00 + lVar33) & (auVar34 | auVar74);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar33) = auVar35;
                    *(undefined1 (*) [16])
                     ((long)((result->field_4).rowcols)->score_row + lVar33 + lVar29) =
                         auVar35 | auVar72;
                    lVar32 = (long)((result->field_4).rowcols)->score_row + lVar29;
                    *(undefined1 (*) [16])(lVar33 + lVar32) =
                         (*(undefined1 (*) [16])(lVar33 + lVar32) & auVar13 | auVar57 & auVar63) ^
                         auVar11;
                    auVar56._0_4_ = uVar43 - open;
                    auVar56._4_4_ = uVar47 - open;
                    auVar56._8_4_ = uVar48 - open;
                    auVar56._12_4_ = uVar50 - open;
                    piVar3 = (int *)((long)*ptr + lVar33);
                    auVar36._0_4_ = *piVar3 - gap;
                    auVar36._4_4_ = piVar3[1] - gap;
                    auVar36._8_4_ = piVar3[2] - gap;
                    auVar36._12_4_ = piVar3[3] - gap;
                    auVar65._0_4_ = -(uint)(auVar36._0_4_ < auVar56._0_4_);
                    auVar65._4_4_ = -(uint)(auVar36._4_4_ < auVar56._4_4_);
                    auVar65._8_4_ = -(uint)(auVar36._8_4_ < auVar56._8_4_);
                    auVar65._12_4_ = -(uint)(auVar36._12_4_ < auVar56._12_4_);
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar33) =
                         ~auVar65 & auVar36 | auVar56 & auVar65;
                    if (uVar1 < local_d8) {
                      lVar32 = (long)((result->field_4).rowcols)->score_row + local_b8;
                      *(undefined1 (*) [16])(lVar33 + lVar32) = auVar65 & auVar59 ^ auVar42;
                    }
                    auVar37._0_4_ = -(uint)(auVar64._0_4_ < (int)uVar43);
                    auVar37._4_4_ = -(uint)(auVar64._4_4_ < (int)uVar47);
                    auVar37._8_4_ = -(uint)(auVar64._8_4_ < (int)uVar48);
                    auVar37._12_4_ = -(uint)(auVar64._12_4_ < (int)uVar50);
                    auVar64 = ~auVar37 & auVar64 | auVar45 & auVar37;
                    auVar67._0_4_ = auVar67._0_4_ - gap;
                    auVar67._4_4_ = iVar69 - gap;
                    auVar67._8_4_ = iVar70 - gap;
                    auVar67._12_4_ = iVar71 - gap;
                    auVar38._0_4_ = -(uint)(auVar67._0_4_ < auVar56._0_4_);
                    auVar38._4_4_ = -(uint)(auVar67._4_4_ < auVar56._4_4_);
                    auVar38._8_4_ = -(uint)(auVar67._8_4_ < auVar56._8_4_);
                    auVar38._12_4_ = -(uint)(auVar67._12_4_ < auVar56._12_4_);
                    iVar31 = movmskps((int)lVar32,auVar38);
                    if (iVar31 == 0xf) goto LAB_0066f4ee;
                    auVar83._0_4_ = auVar80._0_4_ - gap;
                    auVar83._4_4_ = auVar80._4_4_ - gap;
                    auVar83._8_4_ = auVar80._8_4_ - gap;
                    auVar83._12_4_ = auVar80._12_4_ - gap;
                    auVar79._0_4_ = -(uint)(auVar83._0_4_ < auVar56._0_4_);
                    auVar79._4_4_ = -(uint)(auVar83._4_4_ < auVar56._4_4_);
                    auVar79._8_4_ = -(uint)(auVar83._8_4_ < auVar56._8_4_);
                    auVar79._12_4_ = -(uint)(auVar83._12_4_ < auVar56._12_4_);
                    auVar80 = ~auVar79 & auVar83 | auVar56 & auVar79;
                    piVar3 = (int *)((long)*ptr_02 + lVar33);
                    iVar31 = *piVar3;
                    iVar40 = piVar3[1];
                    iVar41 = piVar3[2];
                    iVar51 = piVar3[3];
                    lVar33 = lVar33 + 0x10;
                  } while (lVar25 != lVar33);
                  iVar14 = iVar14 + 1;
                } while (iVar14 != 4);
LAB_0066f4ee:
                auVar39._0_4_ = -(uint)((int)uVar15 < auVar64._0_4_);
                auVar39._4_4_ = -(uint)((int)uVar22 < auVar64._4_4_);
                iVar40 = auVar64._8_4_;
                iVar41 = auVar64._12_4_;
                auVar39._8_4_ = -(uint)((int)uVar23 < iVar40);
                auVar39._12_4_ = -(uint)((int)uVar44 < iVar41);
                iVar31 = movmskps(iVar14,auVar39);
                iVar14 = local_104;
                if ((iVar31 != 0) &&
                   (auVar58._0_4_ = -(uint)(iVar40 < auVar64._0_4_),
                   auVar58._4_4_ = -(uint)(iVar41 < auVar64._4_4_),
                   auVar58._8_4_ = -(uint)(0 < iVar40), auVar58._12_4_ = -(uint)(0 < iVar41),
                   auVar67 = ~auVar58 & auVar64 >> 0x40 | auVar64 & auVar58, uVar22 = auVar67._4_4_,
                   uVar23 = auVar67._0_4_, uVar44 = -(uint)((int)uVar22 < (int)uVar23),
                   uVar15 = ~uVar44 & uVar22 | uVar23 & uVar44, uVar22 = uVar15, uVar23 = uVar15,
                   uVar44 = uVar15, local_10c = uVar15, iVar14 = (int)uVar30,
                   0x7ffffffe - iVar16 < (int)uVar15)) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                  local_d8 = uVar30;
                  goto LAB_0066f590;
                }
                local_104 = iVar14;
                local_b8 = local_b8 + lVar25;
                lVar29 = lVar29 + lVar25;
                palVar18 = ptr_01;
                uVar30 = uVar1;
                palVar17 = ptr_02;
                if (uVar1 == local_d8) {
LAB_0066f590:
                  if (local_10c == 0x7fffffff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar16 = parasail_result_is_saturated(result);
                  uVar22 = 0;
                  palVar18 = b;
                  if (iVar16 == 0) {
                    palVar27 = ptr_02;
                    palVar17 = local_f8;
                    if (local_104 == (int)local_d8 + -2) {
                      palVar27 = local_f8;
                      palVar17 = ptr_02;
                    }
                    if (local_104 == (int)local_d8 + -1) {
                      palVar18 = local_f8;
                      palVar17 = b;
                      palVar27 = ptr_02;
                    }
                    ptr_02 = palVar27;
                    local_f8 = palVar17;
                    uVar22 = uVar28 - 1;
                    if ((uVar20 & 0x7ffffffc) != 0) {
                      uVar28 = (uint)uVar20 & 0x7ffffffc;
                      if ((uVar20 & 0x7ffffffc) == 0) {
                        uVar20 = 0;
                        do {
                          uVar23 = (uint)(uVar20 >> 2) & 0x3fffffff;
                          if ((int)uVar22 <= (int)uVar23) {
                            uVar23 = uVar22;
                          }
                          if (*(uint *)((long)*local_f8 + uVar20 * 4) != local_10c) {
                            uVar23 = uVar22;
                          }
                          uVar22 = uVar23;
                          uVar20 = uVar20 + 1;
                        } while (uVar28 != (uint)uVar20);
                      }
                      else {
                        uVar20 = 0;
                        auVar42 = _DAT_00904a60;
                        uVar23 = uVar22;
                        uVar44 = uVar22;
                        uVar15 = uVar22;
                        do {
                          puVar4 = (uint *)((long)*local_f8 + uVar20 * 4);
                          uVar47 = auVar42._4_4_;
                          uVar50 = auVar42._8_4_;
                          uVar52 = auVar42._12_4_;
                          auVar59 = auVar42 & _DAT_00904a70;
                          iVar16 = auVar59._4_4_;
                          auVar63._4_4_ = iVar16;
                          auVar63._0_4_ = iVar16;
                          auVar63._8_4_ = auVar59._12_4_;
                          auVar63._12_4_ = auVar59._12_4_;
                          uVar54 = auVar59._0_4_ * a + (auVar42._0_4_ >> 2);
                          uVar60 = iVar16 * a + (uVar47 >> 2);
                          uVar61 = (int)((auVar59._8_8_ & 0xffffffff) * size) + (uVar50 >> 2);
                          uVar62 = (int)((auVar63._8_8_ & 0xffffffff) * size) + (uVar52 >> 2);
                          uVar43 = -(uint)((int)uVar54 < (int)uVar22);
                          uVar48 = -(uint)((int)uVar60 < (int)uVar23);
                          uVar49 = -(uint)((int)uVar61 < (int)uVar44);
                          uVar53 = -(uint)((int)uVar62 < (int)uVar15);
                          uVar22 = ~-(uint)(*puVar4 == local_10c) & uVar22 |
                                   (~uVar43 & uVar22 | uVar54 & uVar43) &
                                   -(uint)(*puVar4 == local_10c);
                          uVar23 = ~-(uint)(puVar4[1] == local_10c) & uVar23 |
                                   (~uVar48 & uVar23 | uVar60 & uVar48) &
                                   -(uint)(puVar4[1] == local_10c);
                          uVar44 = ~-(uint)(puVar4[2] == local_10c) & uVar44 |
                                   (~uVar49 & uVar44 | uVar61 & uVar49) &
                                   -(uint)(puVar4[2] == local_10c);
                          uVar15 = ~-(uint)(puVar4[3] == local_10c) & uVar15 |
                                   (~uVar53 & uVar15 | uVar62 & uVar53) &
                                   -(uint)(puVar4[3] == local_10c);
                          uVar20 = uVar20 + 4;
                          auVar42._0_4_ = auVar42._0_4_ + 4;
                          auVar42._4_4_ = uVar47 + 4;
                          auVar42._8_4_ = uVar50 + 4;
                          auVar42._12_4_ = uVar52 + 4;
                        } while (uVar28 != uVar20);
                        uVar22 = ~-(uint)((int)uVar22 < (int)uVar44) & uVar44 |
                                 uVar22 & -(uint)((int)uVar22 < (int)uVar44);
                        uVar23 = ~-(uint)((int)uVar23 < (int)uVar15) & uVar15 |
                                 uVar23 & -(uint)((int)uVar23 < (int)uVar15);
                        uVar28 = -(uint)((int)uVar22 < (int)uVar23);
                        uVar22 = ~uVar28 & uVar23 | uVar22 & uVar28;
                      }
                    }
                  }
                  else {
                    local_10c = 0;
                    local_104 = 0;
                  }
                  result->score = local_10c;
                  result->end_query = uVar22;
                  result->end_ref = local_104;
                  parasail_free(local_f8);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_01);
                  parasail_free(b_00);
                  parasail_free(ptr_02);
                  parasail_free(palVar18);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    vTZero = _mm_set1_epi32(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi32(PARASAIL_INS);
    vTDel  = _mm_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi32(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_sub_epi32(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi32_rpl(vH_dag, vZero);
            vH = _mm_max_epi32_rpl(vH_dag, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi32(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi32(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi32(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 4);
            vEF_opn = _mm_slli_si128(vEF_opn, 4);
            vEF_opn = _mm_insert_epi32_rpl(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 4);
            vF_ext = _mm_insert_epi32_rpl(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 4);
            vFa_ext = _mm_insert_epi32_rpl(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 4);
            vFa = _mm_insert_epi32_rpl(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi32_rpl(vHp, vZero);
                    case1 = _mm_cmpeq_epi32(vH, vHp);
                    case2 = _mm_cmpeq_epi32(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                    vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_sub_epi32(vFa, vGapE);
                vFa = _mm_max_epi32_rpl(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}